

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active_info.c
# Opt level: O2

double * inform_local_active_info
                   (int *series,size_t n,size_t m,int b,size_t k,double *ai,inform_error *err)

{
  int *piVar1;
  long lVar2;
  _Bool _Var3;
  double *__ptr;
  ulong uVar4;
  ulong uVar5;
  double *__ptr_00;
  void *__ptr_01;
  int *piVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  int *piVar10;
  int *piVar11;
  size_t sVar12;
  int iVar13;
  size_t sVar14;
  void *pvVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  _Var3 = check_arguments(series,n,m,b,k,err);
  if (_Var3) {
    return (double *)0x0;
  }
  lVar9 = (m - k) * n;
  __ptr = ai;
  if ((ai != (double *)0x0) || (__ptr = (double *)malloc(lVar9 * 8), __ptr != (double *)0x0)) {
    auVar18._8_4_ = (int)(k >> 0x20);
    auVar18._0_8_ = k;
    auVar18._12_4_ = 0x45300000;
    dVar16 = pow((double)b,
                 (auVar18._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)k) - 4503599627370496.0));
    dVar16 = dVar16 * (double)b;
    uVar4 = (ulong)dVar16;
    uVar4 = (long)(dVar16 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4;
    uVar5 = uVar4 / (ulong)(long)b;
    __ptr_00 = (double *)calloc((long)b + uVar4 + uVar5,4);
    if (__ptr_00 == (double *)0x0) {
      __ptr_00 = __ptr;
      if (ai != (double *)0x0) goto LAB_00132c9d;
    }
    else {
      __ptr_01 = malloc(lVar9 * 0xc);
      if (__ptr_01 != (void *)0x0) {
        lVar2 = uVar5 * 4 + uVar4 * 4;
        piVar10 = (int *)((long)__ptr_01 + lVar9 * 4);
        piVar6 = piVar10 + lVar9;
        piVar11 = series + k;
        pvVar15 = __ptr_01;
        for (sVar14 = 0; sVar14 != n; sVar14 = sVar14 + 1) {
          *piVar10 = 0;
          iVar7 = 0;
          iVar13 = 1;
          for (sVar12 = 0; k != sVar12; sVar12 = sVar12 + 1) {
            iVar13 = iVar13 * b;
            iVar7 = iVar7 * b + series[sVar12];
            *piVar10 = iVar7;
          }
          for (lVar8 = 0; k + lVar8 < m; lVar8 = lVar8 + 1) {
            iVar7 = piVar11[lVar8];
            piVar6[lVar8] = iVar7;
            iVar7 = piVar10[lVar8] * b + iVar7;
            *(int *)((long)pvVar15 + lVar8 * 4) = iVar7;
            piVar1 = (int *)((long)__ptr_00 + (long)iVar7 * 4);
            *piVar1 = *piVar1 + 1;
            piVar1 = (int *)((long)__ptr_00 + (long)piVar10[lVar8] * 4 + uVar4 * 4);
            *piVar1 = *piVar1 + 1;
            piVar1 = (int *)((long)__ptr_00 + (long)piVar6[lVar8] * 4 + lVar2);
            *piVar1 = *piVar1 + 1;
            if (~k + m != lVar8) {
              piVar10[lVar8 + 1] = iVar7 - series[lVar8] * iVar13;
            }
          }
          piVar10 = piVar10 + (m - k);
          series = series + m;
          piVar11 = piVar11 + m;
          pvVar15 = (void *)((long)pvVar15 + m * 4 + k * -4);
          piVar6 = piVar6 + (m - k);
        }
        auVar17._8_4_ = (int)((ulong)lVar9 >> 0x20);
        auVar17._0_8_ = lVar9;
        auVar17._12_4_ = 0x45300000;
        for (lVar8 = 0; lVar9 != lVar8; lVar8 = lVar8 + 1) {
          dVar16 = log2(((double)*(uint *)((long)__ptr_00 +
                                          (long)*(int *)((long)__ptr_01 + lVar8 * 4) * 4) *
                        ((auVar17._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0))) /
                        ((double)*(uint *)((long)__ptr_00 +
                                          (long)*(int *)((long)__ptr_01 + lVar8 * 4 + lVar9 * 8) * 4
                                          + lVar2) *
                        (double)*(uint *)((long)__ptr_00 +
                                         (long)*(int *)((long)__ptr_01 + lVar8 * 4 + lVar9 * 4) * 4
                                         + uVar4 * 4)));
          __ptr[lVar8] = dVar16;
        }
        free(__ptr_01);
        free(__ptr_00);
        return __ptr;
      }
      if (ai == (double *)0x0) {
        free(__ptr);
      }
    }
    free(__ptr_00);
  }
LAB_00132c9d:
  if (err != (inform_error *)0x0) {
    *err = INFORM_ENOMEM;
  }
  return (double *)0x0;
}

Assistant:

double *inform_local_active_info(int const *series, size_t n, size_t m, int b,
    size_t k, double *ai, inform_error *err)
{
    if (check_arguments(series, n, m, b, k, err)) return NULL;

    size_t const N = n * (m - k);

    bool allocate_ai = (ai == NULL);
    if (allocate_ai)
    {
        ai = malloc(N * sizeof(double));
        if (ai == NULL)
        {
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
    }

    size_t const states_size = (size_t) (b*pow((double) b,(double) k));
    size_t const histories_size = states_size / b;
    size_t const futures_size = b;
    size_t const total_size = states_size + histories_size + futures_size;

    uint32_t *histogram_data = calloc(total_size, sizeof(uint32_t));
    if (histogram_data == NULL)
    {
        if (allocate_ai) free(ai);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }
    inform_dist states    = { histogram_data, states_size, N };
    inform_dist histories = { histogram_data + states_size, histories_size, N };
    inform_dist futures   = { histogram_data + states_size + histories_size, futures_size, N };

    int *state_data = malloc(3 * N * sizeof(int));
    if (state_data == NULL)
    {
        if (allocate_ai) free(ai);
        free(histogram_data);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }
    int *state   = state_data;
    int *history = state + N;
    int *future  = history + N;

    accumulate_local_observations(series, n, m, b, k, &states, &histories,
        &futures, state, history, future);

    double r, s, t;
    for (size_t i = 0; i < N; ++i)
    {
        r = states.histogram[state[i]];
        s = histories.histogram[history[i]];
        t = futures.histogram[future[i]];
        ai[i] = log2((r * N) / (s * t));
    }

    free(state_data);
    free(histogram_data);

    return ai;
}